

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCoro.hpp
# Opt level: O0

Result SCoro::Impl::
       poll_fn<1ul,SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>>
                 (SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>
                  *self)

{
  Result RVar1;
  type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
  *this;
  SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag> *self_local;
  
  this = &StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
          ::get_at((StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
                    *)self)->
          super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
  ;
  RVar1 = Delay<100U>::
          type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
          ::Poll(this);
  return (Result)RVar1.value;
}

Assistant:

constexpr static Result poll_fn(Stgs & self) noexcept
        {
            return self.get_at(Index<index>{}).Poll();
        }